

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.hpp
# Opt level: O0

bool helics::
     addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
               (value *section,string *targetName,anon_class_8_1_36d583d8 callback)

{
  bool bVar1;
  reference pvVar2;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  target_00;
  basic_value<toml::type_config> *in_RSI;
  string target_1;
  basic_value<toml::type_config> *target;
  iterator __end4;
  iterator __begin4;
  array_type *__range4;
  array_type *targetArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  value uval;
  bool found;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  byte bVar3;
  basic_value<toml::type_config> *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  string_type *in_stack_fffffffffffffdd0;
  basic_value<toml::type_config> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_value<toml::type_config> *this;
  undefined8 in_stack_fffffffffffffe00;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_1d8 [30];
  basic_value<toml::type_config> local_e8;
  byte local_19;
  
  local_19 = 0;
  this = &local_e8;
  toml::basic_value<toml::type_config>::basic_value(in_stack_fffffffffffffdc0);
  toml::find_or<toml::type_config,std::__cxx11::string>
            (in_RSI,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  toml::basic_value<toml::type_config>::basic_value(this,in_RSI);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x3717e4)
  ;
  if (!bVar1) {
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x3717f9);
    if (bVar1) {
      in_stack_fffffffffffffde0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           toml::basic_value<toml::type_config>::as_array
                     ((basic_value<toml::type_config> *)in_stack_fffffffffffffe00);
      local_1d8[1]._M_current = (basic_value<toml::type_config> *)in_stack_fffffffffffffde0;
      local_1d8[2]._M_current = (basic_value<toml::type_config> *)in_stack_fffffffffffffde0;
      local_1d8[0]._M_current =
           (basic_value<toml::type_config> *)
           std::
           vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      std::
      vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
      ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      while (bVar1 = __gnu_cxx::
                     operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_fffffffffffffdc0,
                                (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator*(local_1d8);
        in_stack_fffffffffffffdd8 =
             (basic_value<toml::type_config> *)
             toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                       ((basic_value<toml::type_config> *)in_stack_fffffffffffffe00);
        Federate::registerConnectorInterfacesToml::anon_class_8_1_36d583d8::operator()
                  ((anon_class_8_1_36d583d8 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        __gnu_cxx::
        __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator++(local_1d8);
      }
    }
    else {
      in_stack_fffffffffffffdd0 =
           toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                     ((basic_value<toml::type_config> *)in_stack_fffffffffffffe00);
      Federate::registerConnectorInterfacesToml::anon_class_8_1_36d583d8::operator()
                ((anon_class_8_1_36d583d8 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    }
    local_19 = 1;
  }
  pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffdc0);
  if (*pvVar2 == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc0);
    in_stack_fffffffffffffdc0 = (basic_value<toml::type_config> *)&stack0xfffffffffffffdf8;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdd0);
    target_00 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                          (in_RSI,in_stack_fffffffffffffde0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffdd8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x371975);
    if (!bVar1) {
      local_19 = 1;
      Federate::registerConnectorInterfacesToml::anon_class_8_1_36d583d8::operator()
                ((anon_class_8_1_36d583d8 *)in_stack_fffffffffffffdd0,target_00);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc0);
  }
  bVar3 = local_19;
  toml::basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffffdc0);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffffdc0);
  return (bool)(bVar3 & 1);
}

Assistant:

bool addTargets(const toml::value& section, std::string targetName, Callable callback)
{
    bool found{false};
    toml::value uval;
    // There should probably be a static_assert here but there isn't a nice type trait to check that
    auto targets = toml::find_or(section, targetName, uval);
    if (!targets.is_empty()) {
        if (targets.is_array()) {
            auto& targetArray = targets.as_array();
            for (const auto& target : targetArray) {
                callback(static_cast<const std::string&>(target.as_string()));
            }
        } else {
            callback(static_cast<const std::string&>(targets.as_string()));
        }
        found = true;
    }
    if (targetName.back() == 's') {
        targetName.pop_back();
        std::string target;
        target = toml::find_or(section, targetName, target);
        if (!target.empty()) {
            found = true;
            callback(target);
        }
    }
    return found;
}